

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transpose_sse2.h
# Opt level: O0

void transpose_16bit_8x8(__m128i *in,__m128i *out)

{
  undefined8 uVar1;
  undefined8 uVar2;
  undefined2 *in_RSI;
  undefined8 *in_RDI;
  __m128i a7;
  __m128i a6;
  __m128i a5;
  __m128i a4;
  __m128i a3;
  __m128i a2;
  __m128i a1;
  __m128i a0;
  undefined2 local_308;
  undefined2 uStack_306;
  undefined2 uStack_304;
  undefined2 uStack_302;
  undefined2 local_2f8;
  undefined2 uStack_2f6;
  undefined2 uStack_2f4;
  undefined2 uStack_2f2;
  undefined2 local_2e8;
  undefined2 uStack_2e6;
  undefined2 uStack_2e4;
  undefined2 uStack_2e2;
  undefined2 local_2d8;
  undefined2 uStack_2d6;
  undefined2 uStack_2d4;
  undefined2 uStack_2d2;
  undefined2 local_2c8;
  undefined2 uStack_2c6;
  undefined2 uStack_2c4;
  undefined2 uStack_2c2;
  undefined2 local_2b8;
  undefined2 uStack_2b6;
  undefined2 uStack_2b4;
  undefined2 uStack_2b2;
  undefined2 local_2a8;
  undefined2 uStack_2a6;
  undefined2 uStack_2a4;
  undefined2 uStack_2a2;
  undefined2 local_298;
  undefined2 uStack_296;
  undefined2 uStack_294;
  undefined2 uStack_292;
  undefined2 uStack_280;
  undefined2 uStack_27e;
  undefined2 uStack_27c;
  undefined2 uStack_27a;
  undefined2 uStack_270;
  undefined2 uStack_26e;
  undefined2 uStack_26c;
  undefined2 uStack_26a;
  undefined2 uStack_260;
  undefined2 uStack_25e;
  undefined2 uStack_25c;
  undefined2 uStack_25a;
  undefined2 uStack_250;
  undefined2 uStack_24e;
  undefined2 uStack_24c;
  undefined2 uStack_24a;
  undefined2 uStack_240;
  undefined2 uStack_23e;
  undefined2 uStack_23c;
  undefined2 uStack_23a;
  undefined2 uStack_230;
  undefined2 uStack_22e;
  undefined2 uStack_22c;
  undefined2 uStack_22a;
  undefined2 uStack_220;
  undefined2 uStack_21e;
  undefined2 uStack_21c;
  undefined2 uStack_21a;
  undefined2 uStack_210;
  undefined2 uStack_20e;
  undefined2 uStack_20c;
  undefined2 uStack_20a;
  __m128i b7;
  __m128i b6;
  __m128i b5;
  __m128i b4;
  __m128i b3;
  __m128i b2;
  __m128i b1;
  __m128i b0;
  
  uVar1 = *in_RDI;
  uVar2 = in_RDI[2];
  local_298 = (undefined2)uVar1;
  uStack_296 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_294 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_292 = (undefined2)((ulong)uVar1 >> 0x30);
  local_2a8 = (undefined2)uVar2;
  uStack_2a6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_2a4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_2a2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[4];
  uVar2 = in_RDI[6];
  local_2b8 = (undefined2)uVar1;
  uStack_2b6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2b4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2b2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_2c8 = (undefined2)uVar2;
  uStack_2c6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_2c4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_2c2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[8];
  uVar2 = in_RDI[10];
  local_2d8 = (undefined2)uVar1;
  uStack_2d6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2d4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2d2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_2e8 = (undefined2)uVar2;
  uStack_2e6 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_2e4 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_2e2 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[0xc];
  uVar2 = in_RDI[0xe];
  local_2f8 = (undefined2)uVar1;
  uStack_2f6 = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_2f4 = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_2f2 = (undefined2)((ulong)uVar1 >> 0x30);
  local_308 = (undefined2)uVar2;
  uStack_306 = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_304 = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_302 = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[1];
  uVar2 = in_RDI[3];
  uStack_210 = (undefined2)uVar1;
  uStack_20e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_20c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_20a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_220 = (undefined2)uVar2;
  uStack_21e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_21c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_21a = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[5];
  uVar2 = in_RDI[7];
  uStack_230 = (undefined2)uVar1;
  uStack_22e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_22c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_22a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_240 = (undefined2)uVar2;
  uStack_23e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_23c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_23a = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[9];
  uVar2 = in_RDI[0xb];
  uStack_250 = (undefined2)uVar1;
  uStack_24e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_24c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_24a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_260 = (undefined2)uVar2;
  uStack_25e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_25c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_25a = (undefined2)((ulong)uVar2 >> 0x30);
  uVar1 = in_RDI[0xd];
  uVar2 = in_RDI[0xf];
  uStack_270 = (undefined2)uVar1;
  uStack_26e = (undefined2)((ulong)uVar1 >> 0x10);
  uStack_26c = (undefined2)((ulong)uVar1 >> 0x20);
  uStack_26a = (undefined2)((ulong)uVar1 >> 0x30);
  uStack_280 = (undefined2)uVar2;
  uStack_27e = (undefined2)((ulong)uVar2 >> 0x10);
  uStack_27c = (undefined2)((ulong)uVar2 >> 0x20);
  uStack_27a = (undefined2)((ulong)uVar2 >> 0x30);
  *in_RSI = local_298;
  in_RSI[1] = local_2a8;
  in_RSI[2] = local_2b8;
  in_RSI[3] = local_2c8;
  in_RSI[4] = local_2d8;
  in_RSI[5] = local_2e8;
  in_RSI[6] = local_2f8;
  in_RSI[7] = local_308;
  in_RSI[8] = uStack_296;
  in_RSI[9] = uStack_2a6;
  in_RSI[10] = uStack_2b6;
  in_RSI[0xb] = uStack_2c6;
  in_RSI[0xc] = uStack_2d6;
  in_RSI[0xd] = uStack_2e6;
  in_RSI[0xe] = uStack_2f6;
  in_RSI[0xf] = uStack_306;
  in_RSI[0x10] = uStack_294;
  in_RSI[0x11] = uStack_2a4;
  in_RSI[0x12] = uStack_2b4;
  in_RSI[0x13] = uStack_2c4;
  in_RSI[0x14] = uStack_2d4;
  in_RSI[0x15] = uStack_2e4;
  in_RSI[0x16] = uStack_2f4;
  in_RSI[0x17] = uStack_304;
  in_RSI[0x18] = uStack_292;
  in_RSI[0x19] = uStack_2a2;
  in_RSI[0x1a] = uStack_2b2;
  in_RSI[0x1b] = uStack_2c2;
  in_RSI[0x1c] = uStack_2d2;
  in_RSI[0x1d] = uStack_2e2;
  in_RSI[0x1e] = uStack_2f2;
  in_RSI[0x1f] = uStack_302;
  in_RSI[0x20] = uStack_210;
  in_RSI[0x21] = uStack_220;
  in_RSI[0x22] = uStack_230;
  in_RSI[0x23] = uStack_240;
  in_RSI[0x24] = uStack_250;
  in_RSI[0x25] = uStack_260;
  in_RSI[0x26] = uStack_270;
  in_RSI[0x27] = uStack_280;
  in_RSI[0x28] = uStack_20e;
  in_RSI[0x29] = uStack_21e;
  in_RSI[0x2a] = uStack_22e;
  in_RSI[0x2b] = uStack_23e;
  in_RSI[0x2c] = uStack_24e;
  in_RSI[0x2d] = uStack_25e;
  in_RSI[0x2e] = uStack_26e;
  in_RSI[0x2f] = uStack_27e;
  in_RSI[0x30] = uStack_20c;
  in_RSI[0x31] = uStack_21c;
  in_RSI[0x32] = uStack_22c;
  in_RSI[0x33] = uStack_23c;
  in_RSI[0x34] = uStack_24c;
  in_RSI[0x35] = uStack_25c;
  in_RSI[0x36] = uStack_26c;
  in_RSI[0x37] = uStack_27c;
  in_RSI[0x38] = uStack_20a;
  in_RSI[0x39] = uStack_21a;
  in_RSI[0x3a] = uStack_22a;
  in_RSI[0x3b] = uStack_23a;
  in_RSI[0x3c] = uStack_24a;
  in_RSI[0x3d] = uStack_25a;
  in_RSI[0x3e] = uStack_26a;
  in_RSI[0x3f] = uStack_27a;
  return;
}

Assistant:

static inline void transpose_16bit_8x8(const __m128i *const in,
                                       __m128i *const out) {
  // Unpack 16 bit elements. Goes from:
  // in[0]: 00 01 02 03  04 05 06 07
  // in[1]: 10 11 12 13  14 15 16 17
  // in[2]: 20 21 22 23  24 25 26 27
  // in[3]: 30 31 32 33  34 35 36 37
  // in[4]: 40 41 42 43  44 45 46 47
  // in[5]: 50 51 52 53  54 55 56 57
  // in[6]: 60 61 62 63  64 65 66 67
  // in[7]: 70 71 72 73  74 75 76 77
  // to:
  // a0:    00 10 01 11  02 12 03 13
  // a1:    20 30 21 31  22 32 23 33
  // a2:    40 50 41 51  42 52 43 53
  // a3:    60 70 61 71  62 72 63 73
  // a4:    04 14 05 15  06 16 07 17
  // a5:    24 34 25 35  26 36 27 37
  // a6:    44 54 45 55  46 56 47 57
  // a7:    64 74 65 75  66 76 67 77
  const __m128i a0 = _mm_unpacklo_epi16(in[0], in[1]);
  const __m128i a1 = _mm_unpacklo_epi16(in[2], in[3]);
  const __m128i a2 = _mm_unpacklo_epi16(in[4], in[5]);
  const __m128i a3 = _mm_unpacklo_epi16(in[6], in[7]);
  const __m128i a4 = _mm_unpackhi_epi16(in[0], in[1]);
  const __m128i a5 = _mm_unpackhi_epi16(in[2], in[3]);
  const __m128i a6 = _mm_unpackhi_epi16(in[4], in[5]);
  const __m128i a7 = _mm_unpackhi_epi16(in[6], in[7]);

  // Unpack 32 bit elements resulting in:
  // b0: 00 10 20 30  01 11 21 31
  // b1: 40 50 60 70  41 51 61 71
  // b2: 04 14 24 34  05 15 25 35
  // b3: 44 54 64 74  45 55 65 75
  // b4: 02 12 22 32  03 13 23 33
  // b5: 42 52 62 72  43 53 63 73
  // b6: 06 16 26 36  07 17 27 37
  // b7: 46 56 66 76  47 57 67 77
  const __m128i b0 = _mm_unpacklo_epi32(a0, a1);
  const __m128i b1 = _mm_unpacklo_epi32(a2, a3);
  const __m128i b2 = _mm_unpacklo_epi32(a4, a5);
  const __m128i b3 = _mm_unpacklo_epi32(a6, a7);
  const __m128i b4 = _mm_unpackhi_epi32(a0, a1);
  const __m128i b5 = _mm_unpackhi_epi32(a2, a3);
  const __m128i b6 = _mm_unpackhi_epi32(a4, a5);
  const __m128i b7 = _mm_unpackhi_epi32(a6, a7);

  // Unpack 64 bit elements resulting in:
  // out[0]: 00 10 20 30  40 50 60 70
  // out[1]: 01 11 21 31  41 51 61 71
  // out[2]: 02 12 22 32  42 52 62 72
  // out[3]: 03 13 23 33  43 53 63 73
  // out[4]: 04 14 24 34  44 54 64 74
  // out[5]: 05 15 25 35  45 55 65 75
  // out[6]: 06 16 26 36  46 56 66 76
  // out[7]: 07 17 27 37  47 57 67 77
  out[0] = _mm_unpacklo_epi64(b0, b1);
  out[1] = _mm_unpackhi_epi64(b0, b1);
  out[2] = _mm_unpacklo_epi64(b4, b5);
  out[3] = _mm_unpackhi_epi64(b4, b5);
  out[4] = _mm_unpacklo_epi64(b2, b3);
  out[5] = _mm_unpackhi_epi64(b2, b3);
  out[6] = _mm_unpacklo_epi64(b6, b7);
  out[7] = _mm_unpackhi_epi64(b6, b7);
}